

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_messenger.cpp
# Opt level: O0

void __thiscall cppcms::impl::messenger::messenger(messenger *this,string *ip,int port)

{
  socklen_t in_ECX;
  uint in_EDX;
  string *in_RSI;
  messenger *in_RDI;
  string local_48 [52];
  uint local_14;
  
  local_14 = in_EDX;
  booster::noncopyable::noncopyable((noncopyable *)in_RDI);
  booster::aio::stream_socket::stream_socket(&in_RDI->socket_);
  std::__cxx11::string::string((string *)&in_RDI->ip_);
  std::__cxx11::string::string(local_48,in_RSI);
  connect(in_RDI,(int)local_48,(sockaddr *)(ulong)local_14,in_ECX);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

messenger::messenger(std::string ip,int port) :
		socket_()
{
	connect(ip,port);
}